

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsFoldable(Instruction *this)

{
  bool bVar1;
  InstructionFolder *this_00;
  
  bVar1 = IsFoldableByFoldScalar(this);
  if (!bVar1) {
    bVar1 = IsFoldableByFoldVector(this);
    if (!bVar1) {
      this_00 = IRContext::get_instruction_folder(this->context_);
      bVar1 = InstructionFolder::HasConstFoldingRule(this_00,this);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool Instruction::IsFoldable() const {
  return IsFoldableByFoldScalar() || IsFoldableByFoldVector() ||
         context()->get_instruction_folder().HasConstFoldingRule(this);
}